

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

bool wasm::anon_unknown_0::shapeEq(HeapType a,HeapType b)

{
  bool bVar1;
  bool bVar2;
  Struct *a_00;
  Struct *b_00;
  Array local_68;
  Array local_58;
  Signature local_48;
  Signature local_38;
  HeapTypeKind local_28;
  HeapTypeKind local_24;
  HeapTypeKind bKind;
  HeapTypeKind aKind;
  HeapType b_local;
  HeapType a_local;
  
  _bKind = b.id;
  b_local = a;
  bVar1 = HeapType::isOpen(&b_local);
  bVar2 = HeapType::isOpen((HeapType *)&bKind);
  if (bVar1 == bVar2) {
    bVar1 = HeapType::isShared(&b_local);
    bVar2 = HeapType::isShared((HeapType *)&bKind);
    if (bVar1 == bVar2) {
      local_24 = HeapType::getKind(&b_local);
      local_28 = HeapType::getKind((HeapType *)&bKind);
      if (local_24 == local_28) {
        switch(local_24) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                             ,0x240);
        case Func:
          local_38 = HeapType::getSignature(&b_local);
          local_48 = HeapType::getSignature((HeapType *)&bKind);
          a_local.id._7_1_ = shapeEq(local_38,local_48);
          break;
        case Struct:
          a_00 = HeapType::getStruct(&b_local);
          b_00 = HeapType::getStruct((HeapType *)&bKind);
          a_local.id._7_1_ = shapeEq(a_00,b_00);
          break;
        case Array:
          HeapType::getArray((HeapType *)&local_58);
          HeapType::getArray((HeapType *)&local_68);
          a_local.id._7_1_ = shapeEq(&local_58,&local_68);
          break;
        case Cont:
          handle_unreachable("TODO: cont",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                             ,0x23e);
        default:
          a_local.id._7_1_ = false;
        }
      }
      else {
        a_local.id._7_1_ = false;
      }
    }
    else {
      a_local.id._7_1_ = false;
    }
  }
  else {
    a_local.id._7_1_ = false;
  }
  return a_local.id._7_1_;
}

Assistant:

bool shapeEq(HeapType a, HeapType b) {
  // Check whether `a` and `b` have the same top-level structure, including the
  // position and identity of any children that are not included as transitions
  // in the DFA, i.e. any children that are not nontrivial references.
  if (a.isOpen() != b.isOpen()) {
    return false;
  }
  if (a.isShared() != b.isShared()) {
    return false;
  }
  auto aKind = a.getKind();
  auto bKind = b.getKind();
  if (aKind != bKind) {
    return false;
  }
  switch (aKind) {
    case HeapTypeKind::Func:
      return shapeEq(a.getSignature(), b.getSignature());
    case HeapTypeKind::Struct:
      return shapeEq(a.getStruct(), b.getStruct());
    case HeapTypeKind::Array:
      return shapeEq(a.getArray(), b.getArray());
    case HeapTypeKind::Cont:
      WASM_UNREACHABLE("TODO: cont");
    case HeapTypeKind::Basic:
      WASM_UNREACHABLE("unexpected kind");
  }
  return false;
}